

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringtools.hpp
# Opt level: O3

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* stringtools::split_with_delims
            (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *__return_storage_ptr__,string *str,
            set<char,_std::less<char>,_std::allocator<char>_> *delims)

{
  _Rb_tree_header *p_Var1;
  char cVar2;
  _Base_ptr p_Var3;
  ulong uVar4;
  ulong __pos;
  _Base_ptr p_Var5;
  size_type __pos_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uVar4 = str->_M_string_length;
  if (uVar4 != 0) {
    p_Var1 = &(delims->_M_t)._M_impl.super__Rb_tree_header;
    __pos_00 = 0;
    __pos = 0;
    do {
      p_Var3 = (delims->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent;
      if (p_Var3 != (_Base_ptr)0x0) {
        cVar2 = (str->_M_dataplus)._M_p[__pos_00];
        p_Var5 = &p_Var1->_M_header;
        do {
          if (cVar2 <= (char)*(size_t *)(p_Var3 + 1)) {
            p_Var5 = p_Var3;
          }
          p_Var3 = (&p_Var3->_M_left)[(char)*(size_t *)(p_Var3 + 1) < cVar2];
        } while (p_Var3 != (_Base_ptr)0x0);
        if (((_Rb_tree_header *)p_Var5 != p_Var1) &&
           ((char)((_Rb_tree_header *)p_Var5)->_M_node_count <= cVar2)) {
          if (__pos_00 - __pos != 0) {
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                      (&local_50,str,__pos,__pos_00 - __pos);
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<std::__cxx11::string>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                       __return_storage_ptr__,&local_50);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_50._M_dataplus._M_p != &local_50.field_2) {
              operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
            }
          }
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                    (&local_50,str,__pos_00,1);
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                     __return_storage_ptr__,&local_50);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_50._M_dataplus._M_p != &local_50.field_2) {
            operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
          }
          __pos = __pos_00 + 1;
          uVar4 = str->_M_string_length;
        }
      }
      __pos_00 = __pos_00 + 1;
    } while (__pos_00 < uVar4);
    if (__pos <= uVar4 && uVar4 - __pos != 0) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                (&local_50,str,__pos,uVar4 - __pos);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 __return_storage_ptr__,&local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

inline std::vector<std::string> split_with_delims(const std::string& str, const std::set<char>& delims)
    {
        std::vector<std::string> tokens;
        size_t prev = 0;
        for(size_t pos = 0 ; pos < str.length() ; ++pos)
        {
            if(!delims.contains(str[pos]))
                continue;

            if(pos-prev > 0)
                tokens.emplace_back(str.substr(prev, pos-prev));
            tokens.emplace_back(str.substr(pos, 1));
            prev = pos + 1;
        }

        if(prev < str.length())
            tokens.emplace_back(str.substr(prev, str.length()-prev));

        return tokens;
    }